

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

bool iutest::internal::
     iuOperatorEQ<iutest::detail::iu_basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
               (iu_basic_string_view<char,_std::char_traits<char>_> *v1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v2)

{
  bool bVar1;
  iu_basic_string_view<char,_std::char_traits<char>_> lhs;
  pointer local_10;
  size_type local_8;
  
  local_10 = (v2->_M_dataplus)._M_p;
  local_8 = v2->_M_string_length;
  lhs.m_size = (size_type)&local_10;
  lhs.m_data = (const_pointer)v1->m_size;
  bVar1 = detail::operator==((detail *)v1->m_data,lhs,
                             (iu_basic_string_view<char,_std::char_traits<char>_> *)v1->m_size);
  return bVar1;
}

Assistant:

bool iuOperatorEQ(const T1& v1, const T2& v2)
{
IUTEST_PRAGMA_WARN_PUSH()
IUTEST_PRAGMA_WARN_DISABLE_SIGN_COMPARE()
IUTEST_PRAGMA_WARN_DISABLE_IMPLICIT_INT_FLOAT_CONVERSION()
    return v1 == v2;
IUTEST_PRAGMA_WARN_POP()
}